

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

int __thiscall rcg::System::close(System *this,int __fd)

{
  int extraout_EAX;
  element_type *peVar1;
  lock_guard<std::recursive_mutex> lock;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_ffffffffffffffc0;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffffc0,(mutex_type *)this);
  if ((0 < this->n_open) && (this->n_open = this->n_open + -1, this->n_open == 0)) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bfb2);
    (*peVar1->TLClose)(this->tl);
    this->tl = (void *)0x0;
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr(in_stack_ffffffffffffffc0,this);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
              (in_stack_ffffffffffffffc0,(shared_ptr<GenApi_3_4::CNodeMapRef> *)this);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x13bffe);
    std::shared_ptr<rcg::CPort>::shared_ptr
              ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffffc0,this);
    std::shared_ptr<rcg::CPort>::operator=
              ((shared_ptr<rcg::CPort> *)in_stack_ffffffffffffffc0,(shared_ptr<rcg::CPort> *)this);
    std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x13c028);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x13c050);
  return extraout_EAX;
}

Assistant:

void System::close()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      gentl->TLClose(tl);
      tl=0;

      nodemap=0;
      cport=0;
    }
  }
}